

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.t.cpp
# Opt level: O3

void f(int n)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  undefined8 uStack_38;
  
  iVar2 = 0;
  uStack_38 = in_RAX;
  do {
    do {
      LOCK();
      bVar3 = lock.super_atomic_flag_base.flag == 0;
      if (bVar3) {
        lock.super_atomic_flag_base.flag = (atomic_flag_base)1;
      }
      UNLOCK();
    } while (!bVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Output from thread ",0x13);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,n);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
    lock.super_atomic_flag_base.flag = (atomic_flag_base)0;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  return;
}

Assistant:

void f( int n )
{
	for (int cnt = 0; cnt < 4; ++cnt)
	{
		// acquire lock:
		while ( lock.test_and_set(nonstd::memory_order_acquire) )
		{
			// spin read: only until a cmpxchg might succeed:
//			while( *p )
				_mm_pause();
		}

		std::cout << "Output from thread " << n << '\n';

		// release lock:
		lock.clear(nonstd::memory_order_release);
	}
}